

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

bool __thiscall GrcSymbolTableEntry::IsReadOnlySlotAttr(GrcSymbolTableEntry *this)

{
  bool bVar1;
  bool bVar2;
  allocator local_82;
  allocator local_81;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"position",&local_82);
  bVar1 = FieldIs(this,0,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_80,"collision",&local_82);
    bVar2 = false;
    bVar1 = FieldIs(this,0,&local_80);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_60,"fix",&local_81);
      bVar2 = FieldIs(this,1,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return bVar2;
}

Assistant:

bool GrcSymbolTableEntry::IsReadOnlySlotAttr()
{
	Assert(FitsSymbolType(ksymtSlotAttr));

	if (FieldIs(0, "position"))
		return true;
	else if (FieldIs(0, "collision") && FieldIs(1, "fix"))
		return true;
	else
		return false;
}